

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.tpl.h
# Opt level: O2

Image<r_code::ImageImpl> * r_code::Image<r_code::ImageImpl>::Read(ifstream *stream)

{
  char cVar1;
  Image<r_code::ImageImpl> *this;
  long lVar2;
  ostream *poVar3;
  size_t names_size;
  size_t code_size;
  size_t map_size;
  uint64_t timestamp;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Can\'t read from non-open file");
    std::endl<char,std::char_traits<char>>(poVar3);
    this = (Image<r_code::ImageImpl> *)0x0;
  }
  else {
    std::istream::read((char *)stream,(long)&timestamp);
    std::istream::read((char *)stream,(long)&map_size);
    std::istream::read((char *)stream,(long)&code_size);
    std::istream::read((char *)stream,(long)&names_size);
    this = Build(timestamp,map_size,code_size,names_size);
    lVar2 = r_code::ImageImpl::data();
    get_size(this);
    std::istream::read((char *)stream,lVar2);
  }
  return this;
}

Assistant:

Image<I> *Image<I>::Read(std::ifstream &stream)
{
    if (!stream.is_open()) {
        std::cerr << "Can't read from non-open file" << std::endl;
        return nullptr;
    }

    uint64_t timestamp;
    size_t map_size;
    size_t code_size;
    size_t names_size;
    stream.read((char *)&timestamp, sizeof(uint64_t));
    stream.read((char *)&map_size, sizeof(size_t));
    stream.read((char *)&code_size, sizeof(size_t));
    stream.read((char *)&names_size, sizeof(size_t));
    Image *image = Build(timestamp, map_size, code_size, names_size);
    stream.read((char *)image->data(), image->get_size() * sizeof(uint32_t));
    return image;
}